

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unexepack.cc
# Opt level: O0

void __thiscall explode::unexepack::unexepack(unexepack *this,input_exe_file *inp)

{
  uint16_t uVar1;
  ushort uVar2;
  input *piVar3;
  uint16_t *puVar4;
  decoder_error *pdVar5;
  reference pvVar6;
  allocator<unsigned_char> local_81;
  undefined1 local_80 [4];
  uint16_t bytes_in;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ibuff;
  uint32_t offs;
  uint32_t var_8;
  uint32_t uncompressed_size;
  uint16_t ax;
  short sStack_4e;
  char ch;
  uint32_t p;
  uint16_t hi;
  uint16_t lo;
  uint16_t w;
  uint16_t p_1;
  uint32_t var_36;
  uint32_t len;
  uint16_t signature;
  uint16_t sig_ptr;
  int i;
  anon_union_8_2_f8194b7f u;
  uint32_t var_2c;
  uint16_t local_1a;
  input_exe_file *piStack_18;
  uint16_t ip;
  input_exe_file *inp_local;
  unexepack *this_local;
  
  piStack_18 = inp;
  inp_local = (input_exe_file *)this;
  piVar3 = input_exe_file::file(inp);
  this->m_file = piVar3;
  this->m_exe_file = piStack_18;
  puVar4 = exe_file::operator[](&piStack_18->super_exe_file,INITIAL_IP);
  local_1a = *puVar4;
  if (((local_1a != 0x10) && (local_1a != 0x12)) && (local_1a != 0x14)) {
    pdVar5 = (decoder_error *)__cxa_allocate_exception(0x10);
    decoder_error::decoder_error(pdVar5,"unsupported version");
    __cxa_throw(pdVar5,&decoder_error::typeinfo,decoder_error::~decoder_error);
  }
  puVar4 = exe_file::operator[](&piStack_18->super_exe_file,HEADER_SIZE_PARA);
  this->m_exe_data_start = (uint)*puVar4 << 4;
  puVar4 = exe_file::operator[](&piStack_18->super_exe_file,INITIAL_CS);
  u._0_4_ = this->m_exe_data_start + (uint)*puVar4 * 0x10;
  (*this->m_file->_vptr_input[5])(this->m_file,(ulong)(uint)u._0_4_);
  _signature = this->m_header;
  (*this->m_file->_vptr_input[2])(this->m_file,_signature,0x12);
  for (len = 0; (int)len < 9; len = len + 1) {
    uVar1 = byte_order::from_little_endian(this->m_header[(int)len]);
    this->m_header[(int)len] = uVar1;
  }
  puVar4 = exe_file::operator[](&piStack_18->super_exe_file,INITIAL_IP);
  var_36._2_2_ = (ushort)((int)(uint)(ushort)(*puVar4 - 2) >> 1);
  var_36._0_2_ = _signature[var_36._2_2_];
  if ((uint16_t)var_36 == 0x4252) {
    _w = 0;
    _hi = 0;
    puVar4 = exe_file::operator[](&piStack_18->super_exe_file,INITIAL_IP);
    if (*puVar4 == 0x10) {
      puVar4 = exe_file::operator[](&piStack_18->super_exe_file,INITIAL_IP);
      p._2_2_ = (short)((int)(uint)*puVar4 >> 1) << 1;
      p._0_2_ = _signature[p._2_2_];
      if ((uint16_t)p == 0xe88b) {
        _w = 0x132;
      }
      else {
        _w = 0x125;
      }
    }
    puVar4 = exe_file::operator[](&piStack_18->super_exe_file,INITIAL_IP);
    if (*puVar4 == 0x12) {
      _w = 0x12d;
    }
    puVar4 = exe_file::operator[](&piStack_18->super_exe_file,INITIAL_IP);
    if (*puVar4 == 0x14) {
      _hi = 1;
      _w = 0x131;
    }
    ax = (uint16_t)((uint)u._0_4_ >> 0x10);
    uVar2 = (short)u._0_4_ + (short)_w;
    if (7 < uVar2) {
      ax = ax + 1;
    }
    sStack_4e = uVar2 - 7;
    ax = ax - 1;
    uncompressed_size = CONCAT22(ax,sStack_4e);
    (*this->m_file->_vptr_input[5])(this->m_file,(ulong)uncompressed_size);
    (*this->m_file->_vptr_input[2])(this->m_file,(long)&var_8 + 3,1);
    if (var_8._3_1_ != 'c') {
      pdVar5 = (decoder_error *)__cxa_allocate_exception(0x10);
      decoder_error::decoder_error(pdVar5,"not an exepack");
      __cxa_throw(pdVar5,&decoder_error::typeinfo,decoder_error::~decoder_error);
    }
    var_8._0_2_ = hi + 6;
    puVar4 = exe_file::operator[](&piStack_18->super_exe_file,INITIAL_CS);
    uVar2 = *puVar4;
    puVar4 = exe_file::operator[](&piStack_18->super_exe_file,HEADER_SIZE_PARA);
    ibuff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)*puVar4 << 4;
    (*this->m_file->_vptr_input[5])(this->m_file,(ulong)*puVar4 << 4);
    std::allocator<unsigned_char>::allocator(&local_81);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,(ulong)uVar2 << 4,
               &local_81);
    std::allocator<unsigned_char>::~allocator(&local_81);
    piVar3 = this->m_file;
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,0);
    (*piVar3->_vptr_input[2])(piVar3,pvVar6,(ulong)uVar2 << 4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  }
  return;
}

Assistant:

unexepack::unexepack(input_exe_file& inp)
		: m_file(inp.file()),
		m_exe_file(inp)
	{
		const uint16_t ip = inp[exe_file::INITIAL_IP];
		if (ip != 0x10 && ip != 0x12 && ip != 0x14)
		{
			throw decoder_error ("unsupported version");
		}
		m_exe_data_start = inp[exe_file::HEADER_SIZE_PARA] * 16L;
		uint32_t var_2c = inp[exe_file::INITIAL_CS] * 16L;
		var_2c += m_exe_data_start;
		m_file.seek(var_2c);
		union
		{
			char* bytes;
			uint16_t* words;
		} u;
		u.words = m_header;
		m_file.read_buff (u.bytes, sizeof(m_header));
		for (int i = 0; i < eMAX_HEADER_VAL; i++)
		{
			m_header[i] = byte_order::from_little_endian(m_header[i]);
		}

		uint16_t sig_ptr = inp[exe_file::INITIAL_IP];
		sig_ptr += 0x0FFFE;
		sig_ptr = sig_ptr >> 1;

		uint16_t signature = u.words[sig_ptr];

		if (signature == 0x4252)
		{
			uint32_t len = 0;
			uint32_t var_36 = 0;
			// 10729
			if (inp[exe_file::INITIAL_IP] == 0x10)
			{
				// 10733
				uint16_t p = inp[exe_file::INITIAL_IP] >> 1;
				p = p << 1;
				uint16_t w = u.words[p];
				if (w == 0xe88b)
				{
					// 10750
					// second generation
					len = 0x132;
				}
				else
				{
					len = 0x125;
				}
			}
			if (inp[exe_file::INITIAL_IP] == 0x12)
			{
				len = 0x12d;
			}
			
			if (inp[exe_file::INITIAL_IP] == 0x14)
			{
				var_36 = 1;
				len = 0x131;
			}
			uint16_t lo = var_2c & 0xFFFF;
			uint16_t hi = (var_2c & 0xFFFF0000)>> 16;
			lo += (uint16_t)len;
			if (lo > 7)
			{
				hi++;
			}
			lo = lo + (uint16_t)0xFFF9;
			hi = hi + (uint16_t)0xFFFF;

			uint32_t p = ((uint32_t)hi << 16) | lo;
			m_file.seek(p);
			char ch;
			m_file.read_buff(&ch, 1);

			if (ch != 0x63)
			{
				throw decoder_error("not an exepack");
			}

			uint16_t ax = var_36;
			ax += 6;
			
			uint32_t uncompressed_size = ((uint32_t)u.words[ax] & 0xFFFF) << 4;
			uint32_t var_8 = ((uint32_t)inp[exe_file::INITIAL_CS] & 0xFFFF) << 4;
			uint32_t offs = ((uint32_t)inp[exe_file::HEADER_SIZE_PARA] & 0xFFFF) << 4;
			
			m_file.seek(offs);
			std::vector <uint8_t> ibuff(var_8);
			m_file.read_buff((char*)&ibuff[0], var_8);
			
			uint16_t bytes_in = var_8;

			


		}
		// goto 107f5
		
		return;
	}